

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  short sVar2;
  stbi__uint32 sVar3;
  stbi__uint32 c;
  undefined8 uVar4;
  bool bVar5;
  short sVar6;
  stbi__int16 (*pasVar7) [512];
  byte bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  stbi__jpeg *z;
  char *pcVar17;
  ulong uVar18;
  void *pvVar19;
  code *pcVar20;
  undefined8 *puVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  undefined8 *puVar25;
  short sVar26;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  int why;
  uint why_00;
  uint uVar27;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar28;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  ulong extraout_RDX_03;
  stbi_uc *psVar29;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  undefined1 *puVar30;
  byte *pbVar31;
  uint uVar32;
  stbi__context *psVar33;
  stbi_uc *psVar34;
  ulong uVar35;
  int iVar36;
  short *psVar37;
  long lVar38;
  int iVar39;
  uint uVar40;
  stbi_uc **ppsVar41;
  ulong uVar42;
  long in_FS_OFFSET;
  bool bVar43;
  undefined1 auVar44 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1a4;
  stbi_uc *local_148 [3];
  long lStack_130;
  ulong local_128;
  stbi__int16 (*local_120) [512];
  int local_118;
  int local_114;
  long local_110;
  anon_struct_96_18_0d0905d3 *local_108;
  int *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)calloc(1,0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    z->img_comp[0].raw_data = (void *)0x0;
    z->img_comp[0].raw_coeff = (void *)0x0;
    z->img_comp[1].raw_data = (void *)0x0;
    z->img_comp[1].raw_coeff = (void *)0x0;
    z->img_comp[2].raw_data = (void *)0x0;
    z->img_comp[2].raw_coeff = (void *)0x0;
    z->img_comp[3].raw_data = (void *)0x0;
    z->img_comp[3].raw_coeff = (void *)0x0;
    z->restart_interval = 0;
    local_100 = comp;
    iVar14 = stbi__decode_jpeg_header(z,0);
    uVar40 = extraout_EDX;
    if (iVar14 == 0) {
LAB_0010b93a:
      uVar32 = z->s->img_n;
    }
    else {
      paVar1 = z->img_comp;
      bVar8 = stbi__get_marker(z);
      local_120 = z->fast_ac;
LAB_0010a12f:
      if (bVar8 == 0xda) {
        psVar33 = z->s;
        sVar9 = stbi__get8(psVar33);
        sVar10 = stbi__get8(psVar33);
        bVar8 = stbi__get8(z->s);
        z->scan_n = (uint)bVar8;
        if ((0xfb < (byte)(bVar8 - 5)) && (psVar33 = z->s, (int)(uint)bVar8 <= psVar33->img_n)) {
          paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar9,sVar10);
          if ((uint)CONCAT11(sVar9,sVar10) != (uint)bVar8 * 2 + 6) {
            pcVar17 = "bad SOS len";
            goto LAB_0010b931;
          }
          lVar38 = 0;
          do {
            bVar8 = stbi__get8(psVar33);
            bVar13 = stbi__get8(z->s);
            psVar33 = z->s;
            uVar40 = psVar33->img_n;
            if ((long)(int)uVar40 < 1) {
              uVar35 = 0;
            }
            else {
              uVar35 = 0;
              paVar28 = paVar1;
              while (paVar28->id != (uint)bVar8) {
                uVar35 = uVar35 + 1;
                paVar28 = paVar28 + 1;
                if ((long)(int)uVar40 == uVar35) goto LAB_0010b93a;
              }
            }
            if ((uint)uVar35 == uVar40) goto LAB_0010b93a;
            uVar18 = uVar35 & 0xffffffff;
            paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar18 * 0x60);
            z->img_comp[uVar18].hd = (uint)(bVar13 >> 4);
            if (0x3f < bVar13) {
              pcVar17 = "bad DC huff";
              goto LAB_0010b931;
            }
            paVar28 = paVar1 + uVar18;
            paVar28->ha = bVar13 & 0xf;
            if (3 < (bVar13 & 0xf)) {
              pcVar17 = "bad AC huff";
              goto LAB_0010b931;
            }
            z->order[lVar38] = (uint)uVar35;
            lVar38 = lVar38 + 1;
          } while (lVar38 < z->scan_n);
          bVar8 = stbi__get8(psVar33);
          z->spec_start = (uint)bVar8;
          bVar8 = stbi__get8(z->s);
          z->spec_end = (uint)bVar8;
          bVar8 = stbi__get8(z->s);
          z->succ_high = (uint)(bVar8 >> 4);
          uVar40 = bVar8 & 0xf;
          paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar40;
          z->succ_low = uVar40;
          iVar14 = z->progressive;
          iVar16 = z->spec_start;
          if (iVar14 == 0) {
            if ((iVar16 != 0) || ((0xf < bVar8 || ((bVar8 & 0xf) != 0)))) {
LAB_0010b9c9:
              pcVar17 = "bad SOS";
              goto LAB_0010b931;
            }
            z->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar16) || (0x3f < z->spec_end)) || (z->spec_end < iVar16)) ||
                  ((0xdf < bVar8 || (0xd < uVar40)))) goto LAB_0010b9c9;
          uVar40 = z->scan_n;
          uVar35 = (ulong)uVar40;
          iVar16 = z->restart_interval;
          if (iVar16 == 0) {
            iVar16 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          z->todo = iVar16;
          z->eob_run = 0;
          if (iVar14 == 0) {
            if (uVar40 == 1) {
              iVar14 = z->order[0];
              iVar16 = z->img_comp[iVar14].y + 7 >> 3;
              bVar43 = true;
              uVar40 = 1;
              if (0 < iVar16) {
                uVar32 = paVar1[iVar14].x + 7 >> 3;
                iVar36 = 0;
                local_1a4 = 0;
                do {
                  if (0 < (int)uVar32) {
                    lVar38 = 0;
                    do {
                      iVar23 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar14].hd,
                                          z->huff_ac + paVar1[iVar14].ha,
                                          local_120[paVar1[iVar14].ha],iVar14,
                                          z->dequant[paVar1[iVar14].tq]);
                      uVar40 = extraout_EDX_01;
                      if (iVar23 == 0) goto LAB_0010ae7d;
                      (*z->idct_block_kernel)
                                (paVar1[iVar14].data + lVar38 + iVar36 * paVar1[iVar14].w2,
                                 paVar1[iVar14].w2,local_f8);
                      uVar40 = (uint)extraout_RDX_03;
                      iVar23 = z->todo;
                      z->todo = iVar23 + -1;
                      uVar35 = extraout_RDX_03;
                      if (iVar23 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar40 = extraout_EDX_02;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_0010aa80;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar23 = z->restart_interval;
                        uVar35 = 0x7fffffff;
                        if (iVar23 == 0) {
                          iVar23 = 0x7fffffff;
                        }
                        z->todo = iVar23;
                        z->eob_run = 0;
                      }
                      lVar38 = lVar38 + 8;
                    } while ((ulong)uVar32 * 8 != lVar38);
                  }
                  uVar40 = (uint)uVar35;
                  local_1a4 = local_1a4 + 1;
                  iVar36 = iVar36 + 8;
                } while (local_1a4 != iVar16);
LAB_0010aa80:
                bVar43 = true;
              }
            }
            else {
              uVar40 = z->img_mcu_y;
              uVar35 = (ulong)uVar40;
              bVar43 = true;
              if (0 < (int)uVar40) {
                iVar14 = z->img_mcu_x;
                local_1a4 = 0;
                do {
                  if (0 < iVar14) {
                    uVar32 = 0;
                    do {
                      iVar14 = z->scan_n;
                      if (0 < iVar14) {
                        uVar35 = 0;
                        do {
                          iVar16 = z->order[uVar35];
                          iVar36 = z->img_comp[iVar16].v;
                          if (0 < iVar36) {
                            iVar14 = paVar1[iVar16].h;
                            iVar23 = 0;
                            do {
                              if (0 < iVar14) {
                                iVar36 = 0;
                                do {
                                  iVar15 = paVar1[iVar16].v;
                                  iVar39 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[iVar16].hd,
                                                      z->huff_ac + paVar1[iVar16].ha,
                                                      local_120[paVar1[iVar16].ha],iVar16,
                                                      z->dequant[paVar1[iVar16].tq]);
                                  uVar40 = extraout_EDX_04;
                                  if (iVar39 == 0) goto LAB_0010ae7d;
                                  (*z->idct_block_kernel)
                                            (paVar1[iVar16].data +
                                             (long)(int)((iVar14 * uVar32 + iVar36) * 8) +
                                             (long)((iVar15 * local_1a4 + iVar23) *
                                                    paVar1[iVar16].w2 * 8),paVar1[iVar16].w2,
                                             local_f8);
                                  iVar36 = iVar36 + 1;
                                  iVar14 = paVar1[iVar16].h;
                                } while (iVar36 < iVar14);
                                iVar36 = paVar1[iVar16].v;
                              }
                              iVar23 = iVar23 + 1;
                            } while (iVar23 < iVar36);
                            iVar14 = z->scan_n;
                          }
                          uVar35 = uVar35 + 1;
                        } while ((long)uVar35 < (long)iVar14);
                        iVar16 = z->todo;
                      }
                      uVar40 = (uint)uVar35;
                      bVar43 = true;
                      z->todo = iVar16 + -1;
                      bVar5 = iVar16 < 2;
                      iVar16 = iVar16 + -1;
                      if (bVar5) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar40 = extraout_EDX_05;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_0010ae80;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar16 = z->restart_interval;
                        if (iVar16 == 0) {
                          iVar16 = 0x7fffffff;
                        }
                        z->todo = iVar16;
                        z->eob_run = 0;
                      }
                      uVar32 = uVar32 + 1;
                      uVar35 = (ulong)uVar32;
                      iVar14 = z->img_mcu_x;
                    } while ((int)uVar32 < iVar14);
                    uVar35 = (ulong)(uint)z->img_mcu_y;
                  }
                  bVar43 = true;
                  local_1a4 = local_1a4 + 1;
                  uVar40 = (uint)uVar35;
                } while (local_1a4 < (int)uVar40);
              }
            }
            goto LAB_0010ae80;
          }
          if (uVar40 == 1) {
            local_110 = (long)z->order[0];
            local_114 = z->img_comp[local_110].y + 7 >> 3;
            if (0 < local_114) {
              local_108 = paVar1 + local_110;
              local_118 = z->img_comp[local_110].x + 7 >> 3;
              local_128 = local_128 & 0xffffffff00000000;
              do {
                if (0 < local_118) {
                  iVar14 = 0;
                  do {
                    pasVar7 = local_120;
                    psVar37 = local_108->coeff +
                              (local_108->coeff_w * (int)local_128 + iVar14) * 0x40;
                    uVar35 = (ulong)z->spec_start;
                    if (uVar35 == 0) {
                      iVar16 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar37,z->huff_dc + local_108->hd,(int)local_110);
                      uVar40 = extraout_EDX_00;
                      if (iVar16 == 0) goto LAB_0010b93a;
                    }
                    else {
                      iVar16 = local_108->ha;
                      iVar36 = z->eob_run;
                      bVar8 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar36 == 0) {
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar40 = z->code_buffer;
                            paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar40;
                            uVar32 = (uint)pasVar7[iVar16][uVar40 >> 0x17];
                            iVar36 = (int)uVar35;
                            if (pasVar7[iVar16][uVar40 >> 0x17] == 0) {
                              uVar40 = stbi__jpeg_huff_decode(z,z->huff_ac + iVar16);
                              paVar28 = extraout_RDX_02;
                              if ((int)uVar40 < 0) goto LAB_0010b9ad;
                              uVar32 = uVar40 >> 4;
                              if ((uVar40 & 0xf) == 0) {
                                if (uVar40 < 0xf0) {
                                  iVar36 = 1 << ((byte)uVar32 & 0x1f);
                                  z->eob_run = iVar36;
                                  if (0xf < uVar40) {
                                    iVar36 = stbi__jpeg_get_bits(z,uVar32);
                                    iVar36 = iVar36 + z->eob_run;
                                  }
                                  goto LAB_0010a578;
                                }
                                uVar35 = (ulong)(iVar36 + 0x10);
                              }
                              else {
                                uVar35 = (ulong)((int)((long)iVar36 + (ulong)uVar32) + 1);
                                bVar13 = ""[(long)iVar36 + (ulong)uVar32];
                                iVar36 = stbi__extend_receive(z,uVar40 & 0xf);
                                psVar37[bVar13] = (short)(iVar36 << (bVar8 & 0x1f));
                              }
                            }
                            else {
                              uVar22 = uVar32 & 0xf;
                              if (z->code_bits < (int)uVar22) goto LAB_0010b9ad;
                              lVar38 = (long)iVar36 + (ulong)(uVar32 >> 4 & 0xf);
                              z->code_buffer = uVar40 << (sbyte)uVar22;
                              z->code_bits = z->code_bits - uVar22;
                              uVar35 = (ulong)((int)lVar38 + 1);
                              psVar37[""[lVar38]] = (short)((uVar32 >> 8) << (bVar8 & 0x1f));
                            }
                          } while ((int)uVar35 <= z->spec_end);
                        }
                        else {
LAB_0010a578:
                          z->eob_run = iVar36 + -1;
                        }
                      }
                      else if (iVar36 == 0) {
                        iVar36 = 0x10000 << (bVar8 & 0x1f);
                        do {
                          uVar40 = stbi__jpeg_huff_decode(z,z->huff_ac + iVar16);
                          paVar28 = extraout_RDX_01;
                          if ((int)uVar40 < 0) goto LAB_0010b9ad;
                          uVar32 = uVar40 >> 4;
                          if ((uVar40 & 0xf) == 1) {
                            iVar15 = stbi__jpeg_get_bit(z);
                            iVar23 = 1;
                            if (iVar15 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar26 = (short)(iVar23 << (bVar8 & 0x1f));
                          }
                          else {
                            if ((uVar40 & 0xf) != 0) goto LAB_0010b9ad;
                            if (uVar40 < 0xf0) {
                              z->eob_run = ~(-1 << ((byte)uVar32 & 0x1f));
                              if (0xf < uVar40) {
                                iVar23 = stbi__jpeg_get_bits(z,uVar32);
                                z->eob_run = z->eob_run + iVar23;
                              }
                              sVar26 = 0;
                              uVar32 = 0x40;
                            }
                            else {
                              sVar26 = 0;
                              uVar32 = 0xf;
                            }
                          }
                          uVar40 = z->spec_end;
                          uVar18 = (ulong)uVar40;
                          if ((int)uVar35 <= (int)uVar40) {
                            uVar42 = (long)(int)uVar35;
                            do {
                              uVar40 = (uint)uVar18;
                              bVar13 = ""[uVar42];
                              if (psVar37[bVar13] == 0) {
                                if (uVar32 == 0) {
                                  uVar35 = (ulong)((int)uVar42 + 1);
                                  psVar37[bVar13] = sVar26;
                                  break;
                                }
                                uVar32 = uVar32 - 1;
                              }
                              else {
                                iVar23 = stbi__jpeg_get_bit(z);
                                if ((iVar23 != 0) &&
                                   (sVar2 = psVar37[bVar13], (iVar36 >> 0x10 & (int)sVar2) == 0)) {
                                  sVar6 = (short)((uint)iVar36 >> 0x10);
                                  if (sVar2 < 1) {
                                    sVar6 = -sVar6;
                                  }
                                  psVar37[bVar13] = sVar2 + sVar6;
                                }
                              }
                              uVar35 = uVar42 + 1;
                              uVar40 = z->spec_end;
                              uVar18 = (ulong)(int)uVar40;
                              bVar43 = (long)uVar42 < (long)uVar18;
                              uVar42 = uVar35;
                            } while (bVar43);
                          }
                        } while ((int)uVar35 <= (int)uVar40);
                      }
                      else {
                        z->eob_run = iVar36 + -1;
                        if (z->spec_start <= z->spec_end) {
                          uVar40 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                          do {
                            bVar8 = ""[uVar35];
                            if (((psVar37[bVar8] != 0) &&
                                (iVar16 = stbi__jpeg_get_bit(z), iVar16 != 0)) &&
                               (sVar26 = psVar37[bVar8], (uVar40 & (int)sVar26) == 0)) {
                              uVar32 = -uVar40;
                              if (0 < sVar26) {
                                uVar32 = uVar40;
                              }
                              psVar37[bVar8] = (short)uVar32 + sVar26;
                            }
                            bVar43 = (long)uVar35 < (long)z->spec_end;
                            uVar35 = uVar35 + 1;
                          } while (bVar43);
                        }
                      }
                    }
                    iVar16 = z->todo;
                    z->todo = iVar16 + -1;
                    if (iVar16 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar8 = z->marker;
                      if ((bVar8 & 0xf8) != 0xd0) goto LAB_0010ae94;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar16 = z->restart_interval;
                      if (iVar16 == 0) {
                        iVar16 = 0x7fffffff;
                      }
                      z->todo = iVar16;
                      z->eob_run = 0;
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 != local_118);
                }
                iVar14 = (int)local_128 + 1;
                local_128 = CONCAT44(local_128._4_4_,iVar14);
              } while (iVar14 != local_114);
            }
          }
          else {
            iVar14 = z->img_mcu_y;
            if (0 < iVar14) {
              iVar36 = z->img_mcu_x;
              iVar23 = 0;
              do {
                if (0 < iVar36) {
                  iVar14 = 0;
                  do {
                    iVar36 = z->scan_n;
                    if (0 < iVar36) {
                      lVar38 = 0;
                      do {
                        iVar16 = z->order[lVar38];
                        iVar15 = z->img_comp[iVar16].v;
                        if (0 < iVar15) {
                          iVar36 = paVar1[iVar16].h;
                          iVar39 = 0;
                          do {
                            if (0 < iVar36) {
                              iVar15 = 0;
                              do {
                                iVar36 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar16].coeff +
                                                      (iVar36 * iVar14 + iVar15 +
                                                      (paVar1[iVar16].v * iVar23 + iVar39) *
                                                      paVar1[iVar16].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar16].hd,iVar16);
                                uVar40 = extraout_EDX_03;
                                if (iVar36 == 0) goto LAB_0010b93a;
                                iVar15 = iVar15 + 1;
                                iVar36 = paVar1[iVar16].h;
                              } while (iVar15 < iVar36);
                              iVar15 = paVar1[iVar16].v;
                            }
                            iVar39 = iVar39 + 1;
                          } while (iVar39 < iVar15);
                          iVar36 = z->scan_n;
                        }
                        lVar38 = lVar38 + 1;
                      } while (lVar38 < iVar36);
                      iVar16 = z->todo;
                    }
                    z->todo = iVar16 + -1;
                    bVar43 = iVar16 < 2;
                    iVar16 = iVar16 + -1;
                    if (bVar43) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar8 = z->marker;
                      if ((bVar8 & 0xf8) != 0xd0) goto LAB_0010ae94;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar16 = z->restart_interval;
                      if (iVar16 == 0) {
                        iVar16 = 0x7fffffff;
                      }
                      z->todo = iVar16;
                      z->eob_run = 0;
                    }
                    iVar14 = iVar14 + 1;
                    iVar36 = z->img_mcu_x;
                  } while (iVar14 < iVar36);
                  iVar14 = z->img_mcu_y;
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 < iVar14);
            }
          }
          goto LAB_0010ae89;
        }
        pcVar17 = "bad SOS component count";
        paVar28 = extraout_RDX_00;
        goto LAB_0010b931;
      }
      uVar40 = (uint)bVar8;
      if (uVar40 == 0xdc) {
        psVar33 = z->s;
        sVar9 = stbi__get8(psVar33);
        sVar10 = stbi__get8(psVar33);
        psVar33 = z->s;
        sVar11 = stbi__get8(psVar33);
        sVar12 = stbi__get8(psVar33);
        paVar28 = extraout_RDX;
        if (CONCAT11(sVar9,sVar10) == 4) {
          if ((uint)CONCAT11(sVar11,sVar12) == z->s->img_y) goto LAB_0010a1bf;
          pcVar17 = "bad DNL height";
        }
        else {
          pcVar17 = "bad DNL len";
        }
        goto LAB_0010b931;
      }
      if (uVar40 == 0xd9) {
        psVar33 = z->s;
        if ((z->progressive != 0) && (0 < psVar33->img_n)) {
          lVar38 = 0;
          do {
            iVar14 = z->img_comp[lVar38].y + 7 >> 3;
            if (0 < iVar14) {
              uVar40 = paVar1[lVar38].x + 7 >> 3;
              iVar16 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar35 = 0;
                  do {
                    psVar37 = paVar1[lVar38].coeff +
                              (paVar1[lVar38].coeff_w * iVar16 + (int)uVar35) * 0x40;
                    iVar36 = paVar1[lVar38].tq;
                    lVar24 = 0;
                    do {
                      psVar37[lVar24] = psVar37[lVar24] * z->dequant[iVar36][lVar24];
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar38].data +
                               uVar35 * 8 + (long)(iVar16 * 8 * paVar1[lVar38].w2),paVar1[lVar38].w2
                               ,psVar37);
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != uVar40);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != iVar14);
              psVar33 = z->s;
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 < psVar33->img_n);
        }
      }
      else {
        iVar14 = stbi__process_marker(z,uVar40);
        if (iVar14 != 0) goto LAB_0010a1bf;
        psVar33 = z->s;
      }
      uVar32 = psVar33->img_n;
      uVar40 = (2 < (int)uVar32) + 1 + (uint)(2 < (int)uVar32);
      if (req_comp != 0) {
        uVar40 = req_comp;
      }
      if (uVar32 == 3) {
        bVar43 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_0010b0a2;
          bVar43 = z->jfif == 0;
        }
      }
      else {
LAB_0010b0a2:
        bVar43 = false;
      }
      uVar22 = 1;
      if (bVar43) {
        uVar22 = uVar32;
      }
      if (2 < (int)uVar40) {
        uVar22 = uVar32;
      }
      if (uVar32 != 3) {
        uVar22 = uVar32;
      }
      if (0 < (int)uVar22) {
        local_148[2] = (stbi_uc *)0x0;
        lStack_130 = 0;
        local_148[0] = (stbi_uc *)0x0;
        local_148[1] = (stbi_uc *)0x0;
        sVar3 = psVar33->img_x;
        lVar38 = 0;
        do {
          pvVar19 = malloc((ulong)(sVar3 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar38 * 2) = pvVar19;
          if (pvVar19 == (void *)0x0) {
            stbi__free_jpeg_components(z,uVar32,why);
            *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
            pvVar19 = (void *)0x0;
            goto LAB_0010b950;
          }
          uVar35 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar38 * 2);
          iVar14 = (int)uVar35;
          *(int *)((long)local_e0 + lVar38) = iVar14;
          iVar16 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar38 * 2);
          *(int *)((long)local_e0 + lVar38 + 4) = iVar16;
          *(int *)((long)local_e0 + lVar38 + 0xc) = iVar16 >> 1;
          *(int *)((long)local_e0 + lVar38 + 8) =
               (int)((ulong)((sVar3 - 1) + iVar14) / (uVar35 & 0xffffffff));
          *(undefined4 *)((long)local_e0 + lVar38 + 0x10) = 0;
          uVar4 = *(undefined8 *)((long)&z->img_comp[0].data + lVar38 * 2);
          *(undefined8 *)((long)local_f0 + lVar38 + 8) = uVar4;
          *(undefined8 *)((long)local_f0 + lVar38) = uVar4;
          if (iVar14 == 2) {
            pcVar20 = stbi__resample_row_h_2;
            if (iVar16 != 1) {
              if (iVar16 != 2) goto LAB_0010b1da;
              pcVar20 = z->resample_row_hv_2_kernel;
            }
          }
          else if (iVar14 == 1) {
            pcVar20 = stbi__resample_row_generic;
            if (iVar16 == 2) {
              pcVar20 = stbi__resample_row_v_2;
            }
            if (iVar16 == 1) {
              pcVar20 = resample_row_1;
            }
          }
          else {
LAB_0010b1da:
            pcVar20 = stbi__resample_row_generic;
          }
          *(code **)((long)local_f8 + lVar38) = pcVar20;
          lVar38 = lVar38 + 0x30;
        } while ((ulong)uVar22 * 0x30 != lVar38);
        c = psVar33->img_y;
        pvVar19 = stbi__malloc_mad3(uVar40,sVar3,c,1);
        if (pvVar19 != (void *)0x0) {
          uVar27 = why_00;
          if (c != 0) {
            local_128 = (long)pvVar19 + 2;
            iVar14 = 0;
            uVar32 = 0;
            do {
              sVar3 = psVar33->img_x;
              local_120 = (stbi__int16 (*) [512])(ulong)(uVar32 * uVar40 * sVar3);
              ppsVar41 = local_148;
              lVar38 = 0;
              do {
                puVar21 = (undefined8 *)((long)local_f0 + lVar38 + 8);
                iVar16 = *(int *)((long)local_e0 + lVar38 + 0xc);
                iVar36 = *(int *)((long)local_e0 + lVar38 + 4);
                iVar23 = iVar36 >> 1;
                puVar25 = puVar21;
                if (iVar16 < iVar23) {
                  puVar25 = (undefined8 *)((long)local_f0 + lVar38);
                }
                if (iVar23 <= iVar16) {
                  puVar21 = (undefined8 *)((long)local_f0 + lVar38);
                }
                auVar44 = (**(code **)((long)local_f8 + lVar38))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar38 * 2),
                                     *puVar25,*puVar21,*(undefined4 *)((long)local_e0 + lVar38 + 8),
                                     *(undefined4 *)((long)local_e0 + lVar38));
                psVar29 = auVar44._8_8_;
                uVar27 = auVar44._8_4_;
                *ppsVar41 = auVar44._0_8_;
                *(int *)((long)local_e0 + lVar38 + 0xc) = iVar16 + 1;
                if (iVar36 <= iVar16 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar38 + 0xc) = 0;
                  lVar24 = *(long *)((long)local_f0 + lVar38 + 8);
                  *(long *)((long)local_f0 + lVar38) = lVar24;
                  iVar16 = *(int *)((long)local_e0 + lVar38 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar38 + 0x10) = iVar16;
                  if (iVar16 < *(int *)((long)&z->img_comp[0].y + lVar38 * 2)) {
                    *(long *)((long)local_f0 + lVar38 + 8) =
                         lVar24 + *(int *)((long)&z->img_comp[0].w2 + lVar38 * 2);
                  }
                }
                lVar38 = lVar38 + 0x30;
                ppsVar41 = ppsVar41 + 1;
              } while ((ulong)uVar22 * 0x30 != lVar38);
              if ((int)uVar40 < 3) {
                psVar33 = z->s;
                if (bVar43) {
                  if (uVar40 == 1) {
                    if (psVar33->img_x != 0) {
                      uVar35 = 0;
                      do {
                        bVar8 = local_148[2][uVar35];
                        *(char *)((long)pvVar19 + uVar35 + sVar3 * iVar14) =
                             (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                    (uint)local_148[1][uVar35] * 0x96 +
                                    (uint)local_148[0][uVar35] * 0x4d >> 8);
                        uVar35 = uVar35 + 1;
                        psVar29 = local_148[2];
                      } while (uVar35 < psVar33->img_x);
                    }
                  }
                  else if (psVar33->img_x != 0) {
                    uVar35 = 0;
                    do {
                      bVar8 = local_148[2][uVar35];
                      *(char *)((long)pvVar19 + uVar35 * 2 + (ulong)(sVar3 * iVar14)) =
                           (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                  (uint)local_148[1][uVar35] * 0x96 +
                                  (uint)local_148[0][uVar35] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar19 + uVar35 * 2 + (ulong)(sVar3 * iVar14) + 1) =
                           0xff;
                      uVar35 = uVar35 + 1;
                      psVar29 = local_148[2];
                    } while (uVar35 < psVar33->img_x);
                  }
                  goto LAB_0010b8cc;
                }
                if (psVar33->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar33->img_x != 0) {
                      puVar30 = (undefined1 *)((long)pvVar19 + (ulong)(sVar3 * iVar14) + 1);
                      psVar29 = (stbi_uc *)0x0;
                      do {
                        iVar16 = (local_148[0][(long)psVar29] ^ 0xff) * (uint)psVar29[lStack_130];
                        puVar30[-1] = (char)((iVar16 + 0x80U >> 8) + iVar16 + 0x80 >> 8);
                        *puVar30 = 0xff;
                        psVar29 = psVar29 + 1;
                        puVar30 = puVar30 + uVar40;
                      } while (psVar29 < (stbi_uc *)(ulong)psVar33->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0010b664;
                    if (psVar33->img_x != 0) {
                      puVar30 = (undefined1 *)((long)pvVar19 + (ulong)(sVar3 * iVar14) + 1);
                      uVar35 = 0;
                      do {
                        bVar8 = *(byte *)(lStack_130 + uVar35);
                        iVar16 = (uint)local_148[0][uVar35] * (uint)bVar8;
                        iVar36 = (uint)local_148[1][uVar35] * (uint)bVar8;
                        puVar30[-1] = (char)((((uint)local_148[2][uVar35] * (uint)bVar8 + 0x80 >> 8)
                                              + (uint)local_148[2][uVar35] * (uint)bVar8 + 0x80 >> 8
                                             ) * 0x1d +
                                             (iVar36 + (iVar36 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                            8);
                        *puVar30 = 0xff;
                        uVar35 = uVar35 + 1;
                        puVar30 = puVar30 + uVar40;
                        psVar29 = local_148[1];
                      } while (uVar35 < psVar33->img_x);
                      goto LAB_0010b865;
                    }
                  }
                  goto LAB_0010b8cc;
                }
LAB_0010b664:
                if (uVar40 == 1) {
                  if (psVar33->img_x != 0) {
                    uVar35 = 0;
                    do {
                      *(stbi_uc *)((long)pvVar19 + uVar35 + sVar3 * iVar14) = local_148[0][uVar35];
                      uVar35 = uVar35 + 1;
                      uVar27 = psVar33->img_x;
                    } while (uVar35 < uVar27);
                  }
                }
                else if (psVar33->img_x != 0) {
                  uVar35 = 0;
                  do {
                    *(stbi_uc *)((long)pvVar19 + uVar35 * 2 + (ulong)(sVar3 * iVar14)) =
                         local_148[0][uVar35];
                    *(undefined1 *)((long)pvVar19 + uVar35 * 2 + (ulong)(sVar3 * iVar14) + 1) = 0xff
                    ;
                    uVar35 = uVar35 + 1;
                    uVar27 = psVar33->img_x;
                  } while (uVar35 < uVar27);
                }
              }
              else {
                psVar34 = (stbi_uc *)((long)*local_120 + (long)pvVar19);
                psVar33 = z->s;
                if (psVar33->img_n == 3) {
                  if (bVar43) {
                    if (psVar33->img_x != 0) {
                      puVar30 = (undefined1 *)((long)pvVar19 + (ulong)(sVar3 * iVar14) + 3);
                      psVar29 = (stbi_uc *)0x0;
                      do {
                        puVar30[-3] = local_148[0][(long)psVar29];
                        puVar30[-2] = local_148[1][(long)psVar29];
                        puVar30[-1] = local_148[2][(long)psVar29];
                        *puVar30 = 0xff;
                        psVar29 = psVar29 + 1;
                        puVar30 = puVar30 + uVar40;
                      } while (psVar29 < (stbi_uc *)(ulong)psVar33->img_x);
                    }
                  }
                  else {
LAB_0010b6e3:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar34,local_148[0],local_148[1],local_148[2],psVar33->img_x,uVar40)
                    ;
                    psVar33 = z->s;
                    psVar29 = extraout_RDX_04;
                  }
                }
                else if (psVar33->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar34,local_148[0],local_148[1],local_148[2],psVar33->img_x,uVar40)
                    ;
                    psVar33 = z->s;
                    psVar29 = extraout_RDX_05;
                    if (psVar33->img_x != 0) {
                      pbVar31 = (byte *)(sVar3 * iVar14 + local_128);
                      uVar35 = 0;
                      do {
                        bVar8 = *(byte *)(lStack_130 + uVar35);
                        iVar16 = (pbVar31[-2] ^ 0xff) * (uint)bVar8;
                        pbVar31[-2] = (byte)((iVar16 + 0x80U >> 8) + iVar16 + 0x80 >> 8);
                        iVar16 = (pbVar31[-1] ^ 0xff) * (uint)bVar8;
                        pbVar31[-1] = (byte)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8);
                        iVar16 = (*pbVar31 ^ 0xff) * (uint)bVar8;
                        uVar27 = iVar16 + 0x80U >> 8;
                        *pbVar31 = (byte)(iVar16 + uVar27 + 0x80 >> 8);
                        uVar35 = uVar35 + 1;
                        pbVar31 = pbVar31 + uVar40;
                        psVar29 = (stbi_uc *)(ulong)uVar27;
                      } while (uVar35 < psVar33->img_x);
LAB_0010b865:
                      uVar27 = (uint)psVar29;
                      goto LAB_0010b8d0;
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0010b6e3;
                    if (psVar33->img_x != 0) {
                      puVar30 = (undefined1 *)((long)pvVar19 + (ulong)(sVar3 * iVar14) + 3);
                      uVar35 = 0;
                      do {
                        bVar8 = *(byte *)(lStack_130 + uVar35);
                        iVar16 = (uint)local_148[0][uVar35] * (uint)bVar8;
                        puVar30[-3] = (char)((iVar16 + 0x80U >> 8) + iVar16 + 0x80 >> 8);
                        iVar16 = (uint)local_148[1][uVar35] * (uint)bVar8;
                        puVar30[-2] = (char)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8);
                        puVar30[-1] = (char)((uint)local_148[2][uVar35] * (uint)bVar8 +
                                             ((uint)local_148[2][uVar35] * (uint)bVar8 + 0x80 >> 8)
                                             + 0x80 >> 8);
                        *puVar30 = 0xff;
                        uVar35 = uVar35 + 1;
                        puVar30 = puVar30 + uVar40;
                        psVar29 = local_148[2];
                      } while (uVar35 < psVar33->img_x);
                    }
                  }
                }
                else if (psVar33->img_x != 0) {
                  puVar30 = (undefined1 *)((long)pvVar19 + (ulong)(sVar3 * iVar14) + 3);
                  uVar35 = 0;
                  do {
                    sVar9 = local_148[0][uVar35];
                    puVar30[-1] = sVar9;
                    puVar30[-2] = sVar9;
                    puVar30[-3] = sVar9;
                    *puVar30 = 0xff;
                    uVar35 = uVar35 + 1;
                    puVar30 = puVar30 + uVar40;
                  } while (uVar35 < psVar33->img_x);
                  goto LAB_0010b8d0;
                }
LAB_0010b8cc:
                uVar27 = (uint)psVar29;
              }
LAB_0010b8d0:
              uVar32 = uVar32 + 1;
              iVar14 = iVar14 + uVar40;
            } while (uVar32 < psVar33->img_y);
            uVar32 = psVar33->img_n;
          }
          stbi__free_jpeg_components(z,uVar32,uVar27);
          psVar33 = z->s;
          *x = psVar33->img_x;
          *y = psVar33->img_y;
          if (local_100 != (int *)0x0) {
            *local_100 = (uint)(2 < psVar33->img_n) * 2 + 1;
          }
          goto LAB_0010b950;
        }
        stbi__free_jpeg_components(z,uVar32,why_00);
        pcVar17 = "outofmem";
        goto LAB_0010a06c;
      }
    }
    stbi__free_jpeg_components(z,uVar32,uVar40);
  }
  else {
    pcVar17 = "bad req_comp";
LAB_0010a06c:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  }
  pvVar19 = (void *)0x0;
LAB_0010b950:
  free(z);
  return pvVar19;
LAB_0010ae7d:
  bVar43 = false;
LAB_0010ae80:
  if (!bVar43) goto LAB_0010b93a;
LAB_0010ae89:
  bVar8 = z->marker;
LAB_0010ae94:
  if (bVar8 == 0xff) {
    while (psVar33 = z->s, (psVar33->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010af10:
      if (psVar33->img_buffer_end <= psVar33->img_buffer) goto LAB_0010af20;
LAB_0010aea3:
      sVar9 = stbi__get8(z->s);
      while (sVar9 == 0xff) {
        psVar33 = z->s;
        if ((psVar33->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010aece:
          if (psVar33->img_buffer_end <= psVar33->img_buffer) goto LAB_0010af20;
        }
        else {
          iVar14 = (*(psVar33->io).eof)(psVar33->io_user_data);
          if (iVar14 != 0) {
            if (psVar33->read_from_callbacks != 0) goto LAB_0010aece;
            goto LAB_0010af20;
          }
        }
        sVar9 = stbi__get8(z->s);
        if ((byte)(sVar9 - 1) < 0xfe) goto LAB_0010af22;
      }
    }
    iVar14 = (*(psVar33->io).eof)(psVar33->io_user_data);
    if (iVar14 == 0) goto LAB_0010aea3;
    if (psVar33->read_from_callbacks != 0) goto LAB_0010af10;
LAB_0010af20:
    sVar9 = 0xff;
LAB_0010af22:
    z->marker = sVar9;
  }
  bVar8 = stbi__get_marker(z);
  if ((bVar8 & 0xf8) == 0xd0) {
LAB_0010a1bf:
    bVar8 = stbi__get_marker(z);
  }
  goto LAB_0010a12f;
LAB_0010b9ad:
  pcVar17 = "bad huffman code";
LAB_0010b931:
  uVar40 = (uint)paVar28;
  *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  goto LAB_0010b93a;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}